

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O2

void Ssw_ManSweepLatchOne(Ssw_Man_t *p,Aig_Obj_t *pObjRepr,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  abctime aVar6;
  int i;
  int i_00;
  Aig_Obj_t *pNew;
  Aig_Obj_t *pCand;
  uint uVar7;
  Aig_Obj_t *pOld;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                  ,0xa5,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  uVar1 = (uint)*(undefined8 *)&pObjRepr->field_0x18 & 7;
  if (uVar1 != 2) {
    if (((ulong)pObjRepr & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar1 != 1) {
      __assert_fail("Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                    ,0xa6,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  if (((p->nCallsCount < 0x65) || (p->nCallsSat <= p->nCallsUnsat)) ||
     (iVar2 = p->nCallsDelta, p->nCallsDelta = iVar2 + 1, -2 < iVar2)) {
    p->nCallsDelta = 0;
    aVar3 = Abc_Clock();
    pAVar4 = Saig_ObjLoToLi(p->pAig,pObj);
    Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
    pAVar4 = Ssw_ObjChild0Fra(p,pAVar4,i);
    if ((*(uint *)&pObjRepr->field_0x18 & 7) == 2) {
      pAVar5 = Saig_ObjLoToLi(p->pAig,pObjRepr);
      Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe));
      pAVar5 = Ssw_ObjChild0Fra(p,pAVar5,i_00);
    }
    else {
      pAVar5 = p->pNodeToFrames[(long)pObjRepr->Id * (long)p->nFrames];
    }
    aVar6 = Abc_Clock();
    p->timeReduce = p->timeReduce + (aVar6 - aVar3);
    pNew = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
    pOld = (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe);
    if (pNew != pOld) {
      p->nRecycleCalls = p->nRecycleCalls + 1;
      p->nCallsCount = p->nCallsCount + 1;
      uVar7 = 1;
      uVar1 = uVar7;
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        uVar1 = ((uint)pAVar4 ^ *(uint *)&pNew->field_0x18 >> 3) & 1;
      }
      if (pAVar5 != (Aig_Obj_t *)0x0) {
        uVar7 = ((uint)pAVar5 ^ *(uint *)&pOld->field_0x18 >> 3) & 1;
      }
      if ((uVar1 != uVar7) ==
          (((*(ulong *)&pObjRepr->field_0x18 ^ *(ulong *)&pObj->field_0x18) & 8) == 0)) {
        p->nPatterns = p->nPatterns + 1;
        p->nStrangers = p->nStrangers + 1;
      }
      else {
        iVar2 = Ssw_NodesAreEquiv(p,pOld,pNew);
        if (iVar2 == -1) {
          Ssw_ClassesRemoveNode(p->ppClasses,pObj);
          p->nCallsUnsat = p->nCallsUnsat + 1;
        }
        else {
          if (iVar2 == 1) {
            p->nCallsUnsat = p->nCallsUnsat + 1;
            return;
          }
          Ssw_SmlAddPattern(p,pOld,pCand);
          p->nPatterns = p->nPatterns + 1;
          p->nCallsSat = p->nCallsSat + 1;
        }
      }
      p->fRefined = 1;
    }
  }
  return;
}

Assistant:

void Ssw_ManSweepLatchOne( Ssw_Man_t * p, Aig_Obj_t * pObjRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFraig, * pObjReprFraig, * pObjLi;
    int RetValue;
    abctime clk;
    assert( Aig_ObjIsCi(pObj) );
    assert( Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr) );
    // check if it makes sense to skip some calls
    if ( p->nCallsCount > 100 && p->nCallsUnsat < p->nCallsSat )
    {
        if ( ++p->nCallsDelta < 0 )
            return;
    }
    p->nCallsDelta = 0;
clk = Abc_Clock();
    // get the fraiged node
    pObjLi = Saig_ObjLoToLi( p->pAig, pObj );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
    pObjFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    // get the fraiged representative
    if ( Aig_ObjIsCi(pObjRepr) )
    {
        pObjLi = Saig_ObjLoToLi( p->pAig, pObjRepr );
        Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
        pObjReprFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    }
    else
        pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, 0 );
p->timeReduce += Abc_Clock() - clk;
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return;
    p->nRecycleCalls++;
    p->nCallsCount++;

    // check equivalence of the two nodes
    if ( (pObj->fPhase == pObjRepr->fPhase) != (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) )
    {
        p->nPatterns++;
        p->nStrangers++;
        p->fRefined = 1;
    }
    else
    {
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        if ( RetValue == 1 )  // proved equivalence
        {
            p->nCallsUnsat++;
            return;
        }
        if ( RetValue == -1 ) // timed out
        {
            Ssw_ClassesRemoveNode( p->ppClasses, pObj );
            p->nCallsUnsat++;
            p->fRefined = 1;
            return;
        }
        else // disproved equivalence
        {
            Ssw_SmlAddPattern( p, pObjRepr, pObj );
            p->nPatterns++;
            p->nCallsSat++;
            p->fRefined = 1;
        }
    }
}